

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::egl::anon_unknown_0::NoAgeTest::iterate(NoAgeTest *this)

{
  TestLog *log;
  deUint32 err;
  EGLBoolean got;
  Library *egl;
  CallLogWrapper wrapper;
  EGLint damageRegion [4];
  ScopedLogSection local_98;
  string local_90;
  string local_70;
  CallLogWrapper local_50;
  EGLint local_38 [4];
  
  egl = EglTestContext::getLibrary
                  ((this->super_NegativePartialUpdateTest).super_TestCase.m_eglTestCtx);
  log = ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
        m_testCtx)->m_log;
  eglu::CallLogWrapper::CallLogWrapper(&local_50,egl,log);
  local_38[0] = 10;
  local_38[1] = 10;
  local_38[2] = 10;
  local_38[3] = 10;
  local_50.m_enableLog = true;
  tcu::TestContext::setTestResult
            ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Test5","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"If buffer age is not queried --> EGL_BAD_ACCESS","");
  tcu::ScopedLogSection::ScopedLogSection(&local_98,log,&local_70,&local_90);
  tcu::TestLog::endSection(local_98.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  (*egl->_vptr_Library[0x30])
            (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,
             (this->super_NegativePartialUpdateTest).m_eglSurface,0x3093,0x3095);
  err = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(err,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x1bc);
  got = eglu::CallLogWrapper::eglSetDamageRegionKHR
                  (&local_50,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                   (this->super_NegativePartialUpdateTest).m_eglSurface,local_38,1);
  NegativePartialUpdateTest::expectBoolean(&this->super_NegativePartialUpdateTest,0,got);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3002);
  eglu::CallLogWrapper::~CallLogWrapper(&local_50);
  return STOP;
}

Assistant:

TestCase::IterateResult NoAgeTest::iterate (void)
{
	const Library&			egl				= m_eglTestCtx.getLibrary();
	TestLog&				log				= m_testCtx.getLog();
	CallLogWrapper			wrapper			(egl, log);
	EGLint					damageRegion[]	= { 10, 10, 10, 10 };

	wrapper.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	{
		tcu::ScopedLogSection(log, "Test5", "If buffer age is not queried --> EGL_BAD_ACCESS");
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));
		expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, DE_LENGTH_OF_ARRAY(damageRegion)/4));
		expectError(EGL_BAD_ACCESS);
	}

	return STOP;
}